

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O0

bool rtc::hex_decode(char ch,uchar *val)

{
  uchar *val_local;
  char ch_local;
  
  if ((ch < '0') || ('9' < ch)) {
    if ((ch < 'A') || ('Z' < ch)) {
      if ((ch < 'a') || ('z' < ch)) {
        return false;
      }
      *val = ch + 0xa9;
    }
    else {
      *val = ch + 0xc9;
    }
  }
  else {
    *val = ch + 0xd0;
  }
  return true;
}

Assistant:

bool hex_decode(char ch, unsigned char* val) {
  if ((ch >= '0') && (ch <= '9')) {
    *val = ch - '0';
  } else if ((ch >= 'A') && (ch <= 'Z')) {
    *val = (ch - 'A') + 10;
  } else if ((ch >= 'a') && (ch <= 'z')) {
    *val = (ch - 'a') + 10;
  } else {
    return false;
  }
  return true;
}